

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_callback.cc
# Opt level: O2

vector<double,_std::allocator<double>_> *
bidirectional::additiveForwardREF
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *cumulative_resource,
          vector<double,_std::allocator<double>_> *edge_resource_consumption)

{
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,cumulative_resource);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
            ((__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (edge_resource_consumption->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> additiveForwardREF(
    const std::vector<double>& cumulative_resource,
    const std::vector<double>& edge_resource_consumption) {
  // Add element wise
  std::vector<double> new_resources = cumulative_resource;
  std::transform(
      new_resources.begin(),
      new_resources.end(),
      edge_resource_consumption.begin(),
      new_resources.begin(),
      std::plus<double>());
  return new_resources;
}